

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O0

void __thiscall chrono::viper::Viper::SetSuspensionVisualization(Viper *this,bool state)

{
  iterator pvVar1;
  ViperPart *pVVar2;
  iterator pvVar3;
  iterator pvVar4;
  value_type *p_2;
  iterator __end2_2;
  iterator __begin2_2;
  array<std::shared_ptr<chrono::viper::ViperUpright>,_4UL> *__range2_2;
  value_type *p_1;
  iterator __end2_1;
  iterator __begin2_1;
  array<std::shared_ptr<chrono::viper::ViperUpperArm>,_4UL> *__range2_1;
  value_type *p;
  iterator __end2;
  iterator __begin2;
  array<std::shared_ptr<chrono::viper::ViperLowerArm>,_4UL> *__range2;
  bool state_local;
  Viper *this_local;
  
  __end2 = std::array<std::shared_ptr<chrono::viper::ViperLowerArm>,_4UL>::begin
                     (&this->m_lower_arms);
  pvVar1 = std::array<std::shared_ptr<chrono::viper::ViperLowerArm>,_4UL>::end(&this->m_lower_arms);
  for (; __end2 != pvVar1; __end2 = __end2 + 1) {
    pVVar2 = &std::
              __shared_ptr_access<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)__end2)->super_ViperPart;
    ViperPart::SetVisualize(pVVar2,state);
  }
  __end2_1 = std::array<std::shared_ptr<chrono::viper::ViperUpperArm>,_4UL>::begin
                       (&this->m_upper_arms);
  pvVar3 = std::array<std::shared_ptr<chrono::viper::ViperUpperArm>,_4UL>::end(&this->m_upper_arms);
  for (; __end2_1 != pvVar3; __end2_1 = __end2_1 + 1) {
    pVVar2 = &std::
              __shared_ptr_access<chrono::viper::ViperUpperArm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::viper::ViperUpperArm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)__end2_1)->super_ViperPart;
    ViperPart::SetVisualize(pVVar2,state);
  }
  __end2_2 = std::array<std::shared_ptr<chrono::viper::ViperUpright>,_4UL>::begin(&this->m_uprights)
  ;
  pvVar4 = std::array<std::shared_ptr<chrono::viper::ViperUpright>,_4UL>::end(&this->m_uprights);
  for (; __end2_2 != pvVar4; __end2_2 = __end2_2 + 1) {
    pVVar2 = &std::
              __shared_ptr_access<chrono::viper::ViperUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::viper::ViperUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)__end2_2)->super_ViperPart;
    ViperPart::SetVisualize(pVVar2,state);
  }
  return;
}

Assistant:

void Viper::SetSuspensionVisualization(bool state) {
    for (auto& p : m_lower_arms)
        p->SetVisualize(state);
    for (auto& p : m_upper_arms)
        p->SetVisualize(state);
    for (auto& p : m_uprights)
        p->SetVisualize(state);
}